

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O3

bool __thiscall
nowide::basic_stackstring<wchar_t,_char,_5UL>::convert
          (basic_stackstring<wchar_t,_char,_5UL> *this,input_char *begin,input_char *end)

{
  bool bVar1;
  basic_stackstring<wchar_t,_char,_5UL> *buffer;
  wchar_t *pwVar2;
  input_char *buffer_size;
  
  if (this->mem_buffer_ != (output_char *)0x0) {
    operator_delete__(this->mem_buffer_);
    this->mem_buffer_ = (output_char *)0x0;
  }
  this->buffer_[0] = 0;
  buffer_size = end + (1 - (long)begin);
  if (buffer_size < (input_char *)0x6) {
    buffer_size = (input_char *)0x5;
    buffer = this;
  }
  else {
    buffer = (basic_stackstring<wchar_t,_char,_5UL> *)
             operator_new__(-(ulong)((ulong)buffer_size >> 0x3e != 0) | (long)buffer_size * 4);
    this->mem_buffer_ = (output_char *)buffer;
  }
  pwVar2 = basic_convert<wchar_t,char>(buffer->buffer_,(size_t)buffer_size,begin,end);
  bVar1 = true;
  if (pwVar2 == (wchar_t *)0x0) {
    if (this->mem_buffer_ != (output_char *)0x0) {
      operator_delete__(this->mem_buffer_);
      this->mem_buffer_ = (output_char *)0x0;
    }
    this->buffer_[0] = 0;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool convert(input_char const *begin,input_char const *end)
    {
        clear();

        size_t space = get_space(sizeof(input_char),sizeof(output_char),end - begin) + 1;
        if(space <= buffer_size) {
            if(basic_convert(buffer_,buffer_size,begin,end))
                return true;
            clear();
            return false;
        }
        else {
            mem_buffer_ = new output_char[space];
            if(!basic_convert(mem_buffer_,space,begin,end)) {
                clear();
                return false;
            }
            return true;
        }

    }